

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O0

void vkt::createGlslTests(TestCaseGroup *glslTests)

{
  char *pcVar1;
  TestContext *pTVar2;
  TestContext *this;
  TestNode *pTVar3;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> local_30;
  int local_1c;
  TestContext *pTStack_18;
  int ndx;
  TestContext *testCtx;
  TestCaseGroup *glslTests_local;
  
  testCtx = (TestContext *)glslTests;
  pTStack_18 = tcu::TestNode::getTestContext(&glslTests->super_TestNode);
  for (local_1c = 0; this = testCtx, pTVar2 = pTStack_18, local_1c < 9; local_1c = local_1c + 1) {
    pcVar1 = createGlslTests::s_es310Tests[local_1c].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar1,&local_51);
    pcVar1 = createGlslTests::s_es310Tests[local_1c].description;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"vulkan/glsl/es310/",&local_f1);
    std::operator+(&local_d0,&local_f0,createGlslTests::s_es310Tests[local_1c].name);
    std::operator+(&local_b0,&local_d0,".test");
    createShaderLibraryGroup(&local_30,pTVar2,&local_50,&local_88,&local_b0);
    pTVar3 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release(&local_30)->super_TestNode;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              (&local_30);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  pTVar3 = &sr::createDerivateTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar2 = testCtx;
  pTVar3 = &sr::createDiscardTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = testCtx;
  pTVar3 = &sr::createIndexingTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = testCtx;
  pTVar3 = &sr::createLoopTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = testCtx;
  pTVar3 = &sr::createMatrixTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = testCtx;
  pTVar3 = &sr::createOperatorTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = testCtx;
  pTVar3 = &sr::createReturnTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = testCtx;
  pTVar3 = &sr::createStructTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = testCtx;
  pTVar3 = &sr::createSwitchTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = testCtx;
  pTVar3 = &sr::createTextureFunctionTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = testCtx;
  pTVar3 = &sr::createTextureGatherTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = testCtx;
  pTVar3 = &sr::createBuiltinVarTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = testCtx;
  pTVar3 = &shaderexecutor::createBuiltinTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = testCtx;
  pTVar3 = &shaderexecutor::createOpaqueTypeIndexingTests(pTStack_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  return;
}

Assistant:

void createGlslTests (tcu::TestCaseGroup* glslTests)
{
	tcu::TestContext&	testCtx		= glslTests->getTestContext();

	// ShaderLibrary-based tests
	static const struct
	{
		const char*		name;
		const char*		description;
	} s_es310Tests[] =
	{
		{ "arrays",						"Arrays"					},
		{ "conditionals",				"Conditional statements"	},
		{ "constant_expressions",		"Constant expressions"		},
		{ "constants",					"Constants"					},
		{ "conversions",				"Type conversions"			},
		{ "functions",					"Functions"					},
		{ "linkage",					"Linking"					},
		{ "scoping",					"Scoping"					},
		{ "swizzles",					"Swizzles"					},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_es310Tests); ndx++)
		glslTests->addChild(createShaderLibraryGroup(testCtx,
													 s_es310Tests[ndx].name,
													 s_es310Tests[ndx].description,
													 std::string("vulkan/glsl/es310/") + s_es310Tests[ndx].name + ".test").release());

	// ShaderRenderCase-based tests
	glslTests->addChild(sr::createDerivateTests			(testCtx));
	glslTests->addChild(sr::createDiscardTests			(testCtx));
	glslTests->addChild(sr::createIndexingTests			(testCtx));
	glslTests->addChild(sr::createLoopTests				(testCtx));
	glslTests->addChild(sr::createMatrixTests			(testCtx));
	glslTests->addChild(sr::createOperatorTests			(testCtx));
	glslTests->addChild(sr::createReturnTests			(testCtx));
	glslTests->addChild(sr::createStructTests			(testCtx));
	glslTests->addChild(sr::createSwitchTests			(testCtx));
	glslTests->addChild(sr::createTextureFunctionTests	(testCtx));
	glslTests->addChild(sr::createTextureGatherTests	(testCtx));
	glslTests->addChild(sr::createBuiltinVarTests		(testCtx));

	// ShaderExecutor-based tests
	glslTests->addChild(shaderexecutor::createBuiltinTests				(testCtx));
	glslTests->addChild(shaderexecutor::createOpaqueTypeIndexingTests	(testCtx));
}